

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O3

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Alex
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this)

{
  int *piVar1;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [64];
  
  this->root_node_ = (AlexNode<int,_int> *)0x0;
  this->superroot_ = (model_node_type *)0x0;
  (this->params_).expected_insert_frac = 1.0;
  (this->params_).max_node_size = 0x1000000;
  (this->params_).approximate_model_computation = true;
  (this->params_).approximate_cost_computation = false;
  (this->derived_params_).max_fanout = 0x200000;
  (this->derived_params_).max_data_node_slots = 0x200000;
  auVar3 = ZEXT432(0) << 0x40;
  (this->stats_).num_keys = auVar3._0_4_;
  (this->stats_).num_model_nodes = auVar3._4_4_;
  (this->stats_).num_data_nodes = auVar3._8_4_;
  (this->stats_).num_expand_and_scales = auVar3._12_4_;
  (this->stats_).num_expand_and_retrains = auVar3._16_4_;
  (this->stats_).num_downward_splits = auVar3._20_4_;
  (this->stats_).num_sideways_splits = auVar3._24_4_;
  (this->stats_).num_model_node_expansions = auVar3._28_4_;
  auVar4 = ZEXT464(0) << 0x20;
  (this->stats_).num_model_node_splits = 0;
  (this->stats_).num_downward_split_keys = auVar4._0_8_;
  (this->stats_).num_sideways_split_keys = auVar4._8_8_;
  (this->stats_).num_model_node_expansion_pointers = auVar4._16_8_;
  (this->stats_).num_model_node_split_pointers = auVar4._24_8_;
  (this->stats_).num_node_lookups = auVar4._32_8_;
  (this->stats_).num_lookups = auVar4._40_8_;
  (this->stats_).num_inserts = auVar4._48_8_;
  (this->stats_).splitting_time = (double)auVar4._56_8_;
  *(undefined1 (*) [64])((long)&(this->stats_).num_sideways_split_keys + 4) = auVar4;
  (this->experimental_params_).splitting_policy_method = 1;
  (this->experimental_params_).allow_splitting_upwards = false;
  (this->istats_).key_domain_min_ = 0x7fffffff;
  (this->istats_).key_domain_max_ = -0x80000000;
  (this->istats_).num_keys_above_key_domain = 0;
  (this->istats_).num_keys_below_key_domain = 0;
  (this->istats_).num_keys_at_last_right_domain_resize = 0;
  (this->istats_).num_keys_at_last_left_domain_resize = 0;
  this_00 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *
            )operator_new(200);
  (this_00->super_AlexNode<int,_int>).is_leaf_ = true;
  (this_00->super_AlexNode<int,_int>).duplication_factor_ = '\0';
  (this_00->super_AlexNode<int,_int>).level_ = 0;
  (this_00->super_AlexNode<int,_int>).cost_ = 0.0;
  (this_00->super_AlexNode<int,_int>).model_.a_ = 0.0;
  (this_00->super_AlexNode<int,_int>).model_.b_ = 0.0;
  (this_00->super_AlexNode<int,_int>)._vptr_AlexNode = (_func_int **)&PTR__AlexDataNode_00164b60;
  this_00->key_less_ = (AlexCompare *)&this->field_0xbc;
  this_00->allocator_ = (allocator<std::pair<int,_int>_> *)&this->field_0xbd;
  auVar3 = ZEXT432(0) << 0x40;
  this_00->next_leaf_ = (self_type *)auVar3._0_8_;
  this_00->prev_leaf_ = (self_type *)auVar3._8_8_;
  this_00->key_slots_ = (int *)auVar3._16_8_;
  this_00->payload_slots_ = (int *)auVar3._24_8_;
  *(undefined1 (*) [32])((long)&this_00->key_slots_ + 4) = auVar3;
  this_00->expansion_threshold_ = 1.0;
  this_00->contraction_threshold_ = 0.0;
  auVar2 = ZEXT816(0) << 0x20;
  this_00->max_slots_ = 0x200000;
  this_00->num_shifts_ = auVar2._0_8_;
  this_00->num_exp_search_iterations_ = auVar2._8_8_;
  *(undefined1 (*) [16])((long)&this_00->num_exp_search_iterations_ + 4) = auVar2;
  this_00->max_key_ = -0x80000000;
  this_00->min_key_ = 0x7fffffff;
  this_00->num_right_out_of_bounds_inserts_ = 0;
  this_00->num_left_out_of_bounds_inserts_ = 0;
  this_00->expected_avg_exp_search_iterations_ = 0.0;
  this_00->expected_avg_shifts_ = 0.0;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::bulk_load
            (this_00,(V *)0x0,0,(LinearModel<int> *)0x0,false);
  this->root_node_ = (AlexNode<int,_int> *)this_00;
  piVar1 = &(this->stats_).num_data_nodes;
  *piVar1 = *piVar1 + 1;
  create_superroot(this);
  return;
}

Assistant:

Alex() {
    // Set up root as empty data node
    auto empty_data_node = new (data_node_allocator().allocate(1))
        data_node_type(key_less_, allocator_);
    empty_data_node->bulk_load(nullptr, 0);
    root_node_ = empty_data_node;
    stats_.num_data_nodes++;
    create_superroot();
  }